

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall Memory::LargeHeapBlock::FinalizeAllObjects(LargeHeapBlock *this)

{
  size_t *psVar1;
  undefined4 *puVar2;
  code *pcVar3;
  uchar uVar4;
  bool bVar5;
  LargeObjectHeader *pLVar6;
  HeapInfo *pHVar7;
  LargeObjectHeader *pLVar8;
  uint uVar9;
  uint index;
  undefined8 *in_FS_OFFSET;
  
  if (this->finalizeCount != 0) {
    if (this->allocCount == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      index = 0;
      do {
        pLVar6 = GetHeaderByIndex(this,index);
        if ((pLVar6 != (LargeObjectHeader *)0x0) &&
           (uVar4 = LargeObjectHeader::GetAttributes(pLVar6,this->heapInfo->recycler->Cookie),
           (char)uVar4 < '\0')) {
          (*(code *)**(undefined8 **)(pLVar6 + 1))(pLVar6 + 1,1);
          (**(code **)(*(long *)(pLVar6 + 1) + 8))(pLVar6 + 1,1);
          psVar1 = &this->heapInfo->liveFinalizableObjectCount;
          *psVar1 = *psVar1 - 1;
          uVar9 = uVar9 + 1;
        }
        index = index + 1;
      } while (index < this->allocCount);
    }
    pLVar6 = this->pendingDisposeObject;
    if (pLVar6 != (LargeObjectHeader *)0x0) {
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      pHVar7 = this->heapInfo;
      do {
        pLVar8 = LargeObjectHeader::GetNext(pLVar6,pHVar7->recycler->Cookie);
        this->pendingDisposeObject = pLVar8;
        uVar4 = LargeObjectHeader::GetAttributes(pLVar6,this->heapInfo->recycler->Cookie);
        if (-1 < (char)uVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar2 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                             ,0x11f,
                             "(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit)"
                             ,
                             "header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit"
                            );
          if (!bVar5) goto LAB_002454ae;
          *puVar2 = 0;
        }
        if ((&this[1].super_HeapBlock._vptr_HeapBlock)[pLVar6->objectIndex] != (_func_int **)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar2 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                             ,0x120,"(this->HeaderList()[header->objectIndex] == nullptr)",
                             "this->HeaderList()[header->objectIndex] == nullptr");
          if (!bVar5) goto LAB_002454ae;
          *puVar2 = 0;
        }
        (**(code **)(*(long *)(pLVar6 + 1) + 8))(pLVar6 + 1,1);
        pHVar7 = this->heapInfo;
        pHVar7->liveFinalizableObjectCount = pHVar7->liveFinalizableObjectCount - 1;
        pHVar7->pendingDisposableObjectCount = pHVar7->pendingDisposableObjectCount - 1;
        uVar9 = uVar9 + 1;
        pLVar6 = this->pendingDisposeObject;
      } while (pLVar6 != (LargeObjectHeader *)0x0);
    }
    if (this->finalizeCount != uVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,299,"(this->finalizeCount == processedCount)",
                         "this->finalizeCount == processedCount");
      if (!bVar5) {
LAB_002454ae:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar2 = 0;
    }
  }
  return;
}

Assistant:

void
LargeHeapBlock::FinalizeAllObjects()
{
    if (this->finalizeCount != 0)
    {
        DebugOnly(uint processedCount = 0);
        for (uint i = 0; i < allocCount; i++)
        {
            LargeObjectHeader * header = this->GetHeaderByIndex(i);
            if (header == nullptr || ((header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit) == 0))
            {
                continue;
            }

            FinalizableObject * finalizableObject = ((FinalizableObject *)header->GetAddress());

            finalizableObject->Finalize(true);
            finalizableObject->Dispose(true);
#ifdef RECYCLER_FINALIZE_CHECK
            this->heapInfo->liveFinalizableObjectCount--;
#endif
            DebugOnly(processedCount++);
        }

        while (pendingDisposeObject != nullptr)
        {
            LargeObjectHeader * header = pendingDisposeObject;
            pendingDisposeObject = header->GetNext(this->heapInfo->recycler->Cookie);
            Assert(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit);
            Assert(this->HeaderList()[header->objectIndex] == nullptr);

            void * objectAddress = header->GetAddress();
            ((FinalizableObject *)objectAddress)->Dispose(true);
#ifdef RECYCLER_FINALIZE_CHECK
            this->heapInfo->liveFinalizableObjectCount--;
            this->heapInfo->pendingDisposableObjectCount--;
#endif
            DebugOnly(processedCount++);
        }

        Assert(this->finalizeCount == processedCount);
    }
}